

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O3

DWORD FlatStream_CheckFile(TBlockStream *pStream)

{
  uint in_ESI;
  ulong uVar1;
  
  if (7 < in_ESI) {
    uVar1 = 0;
    do {
      if (*(char *)((long)&(pStream->super_TFileStream).StreamRead + uVar1) != -1) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while (in_ESI >> 3 != uVar1);
  }
  if (((in_ESI & 7) != 0) &&
     (((uint)*(byte *)((long)&(pStream->super_TFileStream).StreamRead + (ulong)(in_ESI >> 3)) ^
      -1 << (sbyte)(in_ESI & 7)) != 0xffffffff)) {
    return 0;
  }
  return 1;
}

Assistant:

static DWORD FlatStream_CheckFile(TBlockStream * pStream)
{
    LPBYTE FileBitmap = (LPBYTE)pStream->FileBitmap;
    DWORD WholeByteCount = (pStream->BlockCount / 8);
    DWORD ExtraBitsCount = (pStream->BlockCount & 7);
    BYTE ExpectedValue;

    // Verify the whole bytes - their value must be 0xFF
    for(DWORD i = 0; i < WholeByteCount; i++)
    {
        if(FileBitmap[i] != 0xFF)
            return 0;
    }

    // If there are extra bits, calculate the mask
    if(ExtraBitsCount != 0)
    {
        ExpectedValue = (BYTE)((1 << ExtraBitsCount) - 1);
        if(FileBitmap[WholeByteCount] != ExpectedValue)
            return 0;
    }

    // Yes, the file is complete
    return 1;
}